

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

void __thiscall URI::buildString(URI *this)

{
  bool bVar1;
  ulong uVar2;
  string local_30 [8];
  string str;
  URI *this_local;
  
  if ((this->mModified & 1U) != 0) {
    str.field_2._8_8_ = this;
    std::__cxx11::string::string(local_30);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=(local_30,(string *)&this->mScheme);
      std::__cxx11::string::operator+=(local_30,":");
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = std::operator!=(&this->mScheme,"mailto");
      if ((bVar1) && (bVar1 = std::operator!=(&this->mScheme,"news"), bVar1)) {
        std::__cxx11::string::operator+=(local_30,"//");
      }
      std::__cxx11::string::operator+=(local_30,(string *)&this->mAuthority);
    }
    std::__cxx11::string::operator+=(local_30,(string *)&this->mPath);
    buildQuery(this);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=(local_30,"?");
      std::__cxx11::string::operator+=(local_30,(string *)&this->mQueryString);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=(local_30,"#");
      std::__cxx11::string::operator+=(local_30,(string *)&this->mFragment);
    }
    std::__cxx11::string::operator=((string *)&this->mFullString,local_30);
    this->mModified = false;
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void URI::buildString() const
{
	if ( mModified == false )
		return;
	
	string str;
	
	if ( not mScheme.empty() )
	{
		str += mScheme;
		str += ":";
	}
	
	if ( not mAuthority.empty() )
	{
		// These URI's do not add a //
		if ( mScheme != "mailto" && mScheme != "news" )
			str += "//";
		
		str += mAuthority;
	}
		
	str += mPath;
	
	buildQuery();
	
	if ( not mQueryString.empty() )
	{
		str += "?";
		str += mQueryString;
	}
	
	if ( not mFragment.empty() )
	{
		str += "#";
		str += mFragment;
	}
	
	mFullString = str;
	mModified = false;
}